

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MixSegment.hpp
# Opt level: O2

void __thiscall
cppjieba::MixSegment::MixSegment(MixSegment *this,DictTrie *dictTrie,HMMModel *model)

{
  SegmentTagged::SegmentTagged(&this->super_SegmentTagged);
  (this->super_SegmentTagged).super_SegmentBase._vptr_SegmentBase =
       (_func_int **)&PTR__MixSegment_00118cf0;
  MPSegment::MPSegment(&this->mpSeg_,dictTrie);
  HMMSegment::HMMSegment(&this->hmmSeg_,model);
  return;
}

Assistant:

MixSegment(const DictTrie* dictTrie, const HMMModel* model) 
    : mpSeg_(dictTrie), hmmSeg_(model) {
  }